

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bigint * __thiscall fmt::v7::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  sbyte sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  
  if (-1 < shift) {
    this->exp_ = this->exp_ + ((uint)shift >> 5);
    if (((shift & 0x1fU) != 0) &&
       (sVar4 = (this->bigits_).super_buffer<unsigned_int>.size_, sVar4 != 0)) {
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar3 = (sbyte)(shift & 0x1fU);
      sVar6 = 0;
      uVar7 = 0;
      do {
        uVar1 = puVar2[sVar6];
        uVar8 = uVar1 >> (0x20U - sVar3 & 0x1f);
        puVar2[sVar6] = (uVar1 << sVar3) + uVar7;
        sVar6 = sVar6 + 1;
        uVar7 = uVar8;
      } while (sVar4 != sVar6);
      if (uVar8 != 0) {
        uVar5 = sVar4 + 1;
        if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar5) {
          (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
          sVar4 = (this->bigits_).super_buffer<unsigned_int>.size_;
          uVar5 = sVar4 + 1;
        }
        puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
        puVar2[sVar4] = uVar8;
      }
    }
    return this;
  }
  __assert_fail("shift >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x276,"bigint &fmt::detail::bigint::operator<<=(int)");
}

Assistant:

FMT_NOINLINE bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }